

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O1

bool __thiscall HModel::allNonbasicMoveVsWorkArrays_OK(HModel *this)

{
  byte unaff_BL;
  int var;
  ulong uVar1;
  
  uVar1 = 0;
  while( true ) {
    printf("NonbasicMoveVsWorkArrays: var = %2d; nonbasicFlag[var] = %2d\n",uVar1 & 0xffffffff,
           (ulong)(uint)(this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar1]);
    if (((this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start[uVar1] != 0) &&
       (unaff_BL = oneNonbasicMoveVsWorkArrays_OK(this,(int)uVar1), !(bool)unaff_BL)) break;
    uVar1 = uVar1 + 1;
    if ((long)this->numTot <= (long)uVar1) {
LAB_0012b956:
      return (bool)(unaff_BL & 1);
    }
  }
  unaff_BL = 0;
  printf("Error in NonbasicMoveVsWorkArrays for nonbasic variable %d\n",uVar1 & 0xffffffff);
  std::ostream::flush();
  goto LAB_0012b956;
}

Assistant:

bool HModel::allNonbasicMoveVsWorkArrays_OK() {
  bool ok;
  for (int var = 0; var < numTot; ++var) {
    printf("NonbasicMoveVsWorkArrays: var = %2d; nonbasicFlag[var] = %2d\n", var, nonbasicFlag[var]);
    if (!nonbasicFlag[var]) continue;
    ok = oneNonbasicMoveVsWorkArrays_OK(var);
    if (!ok) {
      printf("Error in NonbasicMoveVsWorkArrays for nonbasic variable %d\n", var);cout << flush;
#ifdef JAJH_dev
      assert(ok);
#endif
      return ok;
    }
  }
  //ok must be true if we reach here
  assert(ok);
  return ok;
}